

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O3

void nni_posix_pfd_init(nni_posix_pfd *pfd,int fd,nni_posix_pfd_cb cb,void *arg)

{
  nni_posix_pollq *pnVar1;
  
  pnVar1 = nni_epoll_pqs + fd % nni_epoll_npq;
  fcntl(fd,2,1);
  fcntl(fd,4,0x800);
  nni_atomic_init(&pfd->events);
  nni_atomic_flag_reset(&pfd->stopped);
  nni_atomic_flag_reset(&pfd->closing);
  pfd->pq = pnVar1;
  pfd->fd = fd;
  pfd->cb = cb;
  pfd->arg = arg;
  pfd->added = false;
  (pfd->node).ln_next = (nni_list_node *)0x0;
  (pfd->node).ln_prev = (nni_list_node *)0x0;
  return;
}

Assistant:

void
nni_posix_pfd_init(nni_posix_pfd *pfd, int fd, nni_posix_pfd_cb cb, void *arg)
{
	nni_posix_pollq *pq;

	pq = &nni_epoll_pqs[fd % nni_epoll_npq];

	(void) fcntl(fd, F_SETFD, FD_CLOEXEC);
	(void) fcntl(fd, F_SETFL, O_NONBLOCK);

	nni_atomic_init(&pfd->events);
	nni_atomic_flag_reset(&pfd->stopped);
	nni_atomic_flag_reset(&pfd->closing);

	pfd->pq    = pq;
	pfd->fd    = fd;
	pfd->cb    = cb;
	pfd->arg   = arg;
	pfd->added = false;

	NNI_LIST_NODE_INIT(&pfd->node);
}